

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmaxheap.c
# Opt level: O2

void zmaxheap_test(void)

{
  int iVar1;
  void *__ptr;
  zmaxheap_t *pzVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  float outfv;
  int32_t outv;
  int32_t v;
  zmaxheap_t *local_48;
  long local_40;
  ulong local_38;
  
  __ptr = calloc(4,10000);
  pzVar2 = zmaxheap_create(4);
  uVar10 = 0;
  iVar7 = 0;
  uVar6 = 0;
  uVar8 = 0;
  local_48 = pzVar2;
  while( true ) {
    if (iVar7 == 5000000) {
      printf("max size: %d, zcount %d\n",uVar6,uVar10);
      free(__ptr);
      return;
    }
    if (uVar8 != pzVar2->size) break;
    uVar3 = random();
    local_40 = (long)(int)uVar8;
    if (((int)uVar8 < 10000) && ((uVar3 & 1) == 0)) {
      lVar4 = random();
      v = (int32_t)(lVar4 / 1000);
      *(int32_t *)((long)__ptr + local_40 * 4) = v;
      zmaxheap_add(pzVar2,&v,(float)v);
      uVar8 = uVar8 + 1;
    }
    else {
      uVar3 = 0;
      if (0 < (int)uVar8) {
        uVar3 = (ulong)uVar8;
      }
      uVar11 = 0xffffffffffffffff;
      iVar9 = -1;
      for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
        iVar1 = *(int *)((long)__ptr + uVar5 * 4);
        if (iVar9 < iVar1) {
          uVar11 = uVar5;
          iVar9 = iVar1;
        }
        uVar11 = uVar11 & 0xffffffff;
      }
      local_38 = uVar10;
      iVar1 = zmaxheap_remove_max(local_48,&outv,&outfv);
      uVar10 = local_38;
      pzVar2 = local_48;
      if (uVar8 == 0) {
        uVar8 = 0;
        if (iVar1 != 0) {
          __assert_fail("res == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zmaxheap.c"
                        ,0x189,"void zmaxheap_test()");
        }
      }
      else {
        if ((outfv != (float)outv) || (NAN(outfv) || NAN((float)outv))) {
          __assert_fail("outv == outfv",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zmaxheap.c"
                        ,0x18c,"void zmaxheap_test()");
        }
        if (iVar9 != outv) {
          __assert_fail("maxv == outv",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zmaxheap.c"
                        ,0x18d,"void zmaxheap_test()");
        }
        *(undefined4 *)((long)__ptr + (long)(int)uVar11 * 4) =
             *(undefined4 *)((long)__ptr + local_40 * 4 + -4);
        uVar8 = uVar8 - 1;
      }
    }
    if ((int)uVar6 < (int)uVar8) {
      uVar6 = (ulong)uVar8;
    }
    uVar10 = (ulong)((int)uVar10 + (uint)(uVar8 == 0 && 0 < (int)uVar6));
    iVar7 = iVar7 + 1;
  }
  __assert_fail("sz == heap->size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zmaxheap.c"
                ,0x16c,"void zmaxheap_test()");
}

Assistant:

void zmaxheap_test()
{
    int cap = 10000;
    int sz = 0;
    int32_t *vals = calloc(sizeof(int32_t), cap);

    zmaxheap_t *heap = zmaxheap_create(sizeof(int32_t));

    int maxsz = 0;
    int zcnt = 0;

    for (int iter = 0; iter < 5000000; iter++) {
        assert(sz == heap->size);

        if ((random() & 1) == 0 && sz < cap) {
            // add a value
            int32_t v = (int32_t) (random() / 1000);
            float fv = v;
            assert(v == fv);

            vals[sz] = v;
            zmaxheap_add(heap, &v, fv);
            sz++;

//            printf("add %d %f\n", v, fv);
        } else {
            // remove a value
            int maxv = -1, maxi = -1;

            for (int i = 0; i < sz; i++) {
                if (vals[i] > maxv) {
                    maxv = vals[i];
                    maxi = i;
                }
            }


            int32_t outv;
            float outfv;
            int res = zmaxheap_remove_max(heap, &outv, &outfv);
            if (sz == 0) {
                assert(res == 0);
            } else {
//                printf("%d %d %d %f\n", sz, maxv, outv, outfv);
                assert(outv == outfv);
                assert(maxv == outv);

                // shuffle erase the maximum from our list.
                vals[maxi] = vals[sz - 1];
                sz--;
            }
        }

        if (sz > maxsz)
            maxsz = sz;

        if (maxsz > 0 && sz == 0)
            zcnt++;
    }

    printf("max size: %d, zcount %d\n", maxsz, zcnt);
    free (vals);
}